

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

uint Strings::findLength(tCharPtr _input,size_t limit)

{
  size_t sVar1;
  
  if (_input != (tCharPtr)0x0) {
    sVar1 = strlen(_input);
    return (uint)sVar1;
  }
  return 0;
}

Assistant:

const unsigned int findLength(tCharPtr _input, size_t limit)
    {
#ifdef OwnStringLength

        unsigned int hasZeroByte = 0;
        const char * input = const_cast<const char *>(_input);
        if (!input) return 0;

        if (limit)
        {
            while (limit && *input) { input++; limit--; }
            return (unsigned int)(input - _input);
        }


        Dual dual;
        dual.inp = input;

        // First part, check in byte order as long as the address is not aligned
        for (; (dual.chVal & (sizeof (dual.chVal) - 1)) != 0; ++dual.ch)
            if (!*dual.ch) return (unsigned long int)(dual.inp - input);


        for (;;)
        {
            // We dereference the pointer to 32 bits data access.
            // This is not allowed in current standard, as the data might not exist at this location (however no 32 bit processor can handle non-dword aligned access)
            unsigned int v = *dual.c++;
            // This find a zero byte in a 32 bit word in only 4 operations (this can be extended to 64 bits easily)
            hasZeroByte = (v - 0x01010101UL) & ~v & 0x80808080UL;
            if (hasZeroByte)
            {
                if (!(*(dual.c - 1) & 0x000000ff)) return (unsigned int)(dual.inp - input) - 4;
                if (!(*(dual.c - 1) & 0x0000ff00)) return (unsigned int)(dual.inp - input) - 3;
                if (!(*(dual.c - 1) & 0x00ff0000)) return (unsigned int)(dual.inp - input) - 2;
                if (!(*(dual.c - 1) & 0xff000000)) return (unsigned int)(dual.inp - input) - 1;
            }
        }
#else
        return _input ? (unsigned int)strlen((const char*)_input) : 0;
#endif
        // We should never reach this point
        Platform::breakUnderDebugger();
        return 0;
    }